

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseFileBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *pTVar1;
  undefined8 uVar2;
  bool bVar3;
  UINT8 UVar4;
  USTATUS UVar5;
  char *bytes;
  UByteArray local_f8;
  CBString local_d8;
  CBString local_c0;
  CBString local_a8;
  undefined4 local_8c;
  CBString local_88;
  UByteArray local_60;
  undefined1 local_40 [8];
  UByteArray fileGuid;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  fileGuid.d.field_2._8_8_ = index;
  bVar3 = UModelIndex::isValid(index);
  if (!bVar3) {
    return 1;
  }
  UVar4 = TreeModel::type(this->model,(UModelIndex *)fileGuid.d.field_2._8_8_);
  if (UVar4 != 'B') {
    return 0;
  }
  UVar4 = TreeModel::subtype(this->model,(UModelIndex *)fileGuid.d.field_2._8_8_);
  if (UVar4 == 0xf0) {
    UVar5 = parsePadFileBody(this,(UModelIndex *)fileGuid.d.field_2._8_8_);
    return UVar5;
  }
  UVar4 = TreeModel::subtype(this->model,(UModelIndex *)fileGuid.d.field_2._8_8_);
  if ((UVar4 != '\x01') &&
     (UVar4 = TreeModel::subtype(this->model,(UModelIndex *)fileGuid.d.field_2._8_8_), UVar4 != '\0'
     )) {
    TreeModel::body(&local_f8,this->model,(UModelIndex *)fileGuid.d.field_2._8_8_);
    UVar5 = parseSections(this,&local_f8,(UModelIndex *)fileGuid.d.field_2._8_8_,true);
    UByteArray::~UByteArray(&local_f8);
    return UVar5;
  }
  TreeModel::header(&local_60,this->model,(UModelIndex *)fileGuid.d.field_2._8_8_);
  bytes = UByteArray::constData(&local_60);
  UByteArray::UByteArray((UByteArray *)local_40,bytes,0x10);
  UByteArray::~UByteArray(&local_60);
  bVar3 = UByteArray::operator==((UByteArray *)local_40,&NVRAM_NVAR_STORE_FILE_GUID);
  uVar2 = fileGuid.d.field_2._8_8_;
  if (bVar3) {
    pTVar1 = this->model;
    Bstrlib::CBString::CBString(&local_88,"NVAR store");
    TreeModel::setText(pTVar1,(UModelIndex *)uVar2,&local_88);
    Bstrlib::CBString::~CBString(&local_88);
    this_local = (FfsParser *)
                 NvramParser::parseNvarStore
                           (this->nvramParser,(UModelIndex *)fileGuid.d.field_2._8_8_);
  }
  else {
    bVar3 = UByteArray::operator==
                      ((UByteArray *)local_40,&NVRAM_NVAR_PEI_EXTERNAL_DEFAULTS_FILE_GUID);
    uVar2 = fileGuid.d.field_2._8_8_;
    if (bVar3) {
      pTVar1 = this->model;
      Bstrlib::CBString::CBString(&local_a8,"NVRAM external defaults");
      TreeModel::setText(pTVar1,(UModelIndex *)uVar2,&local_a8);
      Bstrlib::CBString::~CBString(&local_a8);
      this_local = (FfsParser *)
                   NvramParser::parseNvarStore
                             (this->nvramParser,(UModelIndex *)fileGuid.d.field_2._8_8_);
    }
    else {
      bVar3 = UByteArray::operator==((UByteArray *)local_40,&NVRAM_NVAR_BB_DEFAULTS_FILE_GUID);
      uVar2 = fileGuid.d.field_2._8_8_;
      if (bVar3) {
        pTVar1 = this->model;
        Bstrlib::CBString::CBString(&local_c0,"NVAR BB defaults");
        TreeModel::setText(pTVar1,(UModelIndex *)uVar2,&local_c0);
        Bstrlib::CBString::~CBString(&local_c0);
        this_local = (FfsParser *)
                     NvramParser::parseNvarStore
                               (this->nvramParser,(UModelIndex *)fileGuid.d.field_2._8_8_);
      }
      else {
        bVar3 = UByteArray::operator==
                          ((UByteArray *)local_40,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX);
        if (bVar3) {
          this_local = (FfsParser *)
                       parseVendorHashFile(this,(UByteArray *)local_40,
                                           (UModelIndex *)fileGuid.d.field_2._8_8_);
        }
        else {
          bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_0);
          if (((((bVar3) ||
                (bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_1),
                bVar3)) ||
               (bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_2),
               bVar3)) ||
              (((bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_3),
                bVar3 || (bVar3 = UByteArray::operator==
                                            ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_4),
                         bVar3)) ||
               ((bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_5),
                bVar3 || ((bVar3 = UByteArray::operator==
                                             ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_6),
                          bVar3 || (bVar3 = UByteArray::operator==
                                                      ((UByteArray *)local_40,
                                                       &AMI_ROM_HOLE_FILE_GUID_7), bVar3)))))))) ||
             ((bVar3 = UByteArray::operator==((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_8),
              bVar3 || (((((bVar3 = UByteArray::operator==
                                              ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_9),
                           bVar3 || (bVar3 = UByteArray::operator==
                                                       ((UByteArray *)local_40,
                                                        &AMI_ROM_HOLE_FILE_GUID_10), bVar3)) ||
                          (bVar3 = UByteArray::operator==
                                             ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_11),
                          bVar3)) ||
                         ((bVar3 = UByteArray::operator==
                                             ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_12),
                          bVar3 || (bVar3 = UByteArray::operator==
                                                      ((UByteArray *)local_40,
                                                       &AMI_ROM_HOLE_FILE_GUID_13), bVar3)))) ||
                        ((bVar3 = UByteArray::operator==
                                            ((UByteArray *)local_40,&AMI_ROM_HOLE_FILE_GUID_14),
                         bVar3 || (bVar3 = UByteArray::operator==
                                                     ((UByteArray *)local_40,
                                                      &AMI_ROM_HOLE_FILE_GUID_15), bVar3)))))))) {
            uVar2 = fileGuid.d.field_2._8_8_;
            pTVar1 = this->model;
            Bstrlib::CBString::CBString(&local_d8,"AMI ROM hole");
            TreeModel::setText(pTVar1,(UModelIndex *)uVar2,&local_d8);
            Bstrlib::CBString::~CBString(&local_d8);
            TreeModel::setFixed(this->model,(UModelIndex *)fileGuid.d.field_2._8_8_,true);
            this_local = (FfsParser *)0x0;
          }
          else {
            this_local = (FfsParser *)parseRawArea(this,(UModelIndex *)fileGuid.d.field_2._8_8_);
          }
        }
      }
    }
  }
  local_8c = 1;
  UByteArray::~UByteArray((UByteArray *)local_40);
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseFileBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Do not parse non-file bodies
    if (model->type(index) != Types::File)
        return U_SUCCESS;
    
    // Parse padding file body
    if (model->subtype(index) == EFI_FV_FILETYPE_PAD)
        return parsePadFileBody(index);
    
    // Parse raw files as raw areas
    if (model->subtype(index) == EFI_FV_FILETYPE_RAW || model->subtype(index) == EFI_FV_FILETYPE_ALL) {
        UByteArray fileGuid = UByteArray(model->header(index).constData(), sizeof(EFI_GUID));
        
        // Parse NVAR store
        if (fileGuid == NVRAM_NVAR_STORE_FILE_GUID) {
            model->setText(index, UString("NVAR store"));
            return nvramParser->parseNvarStore(index);
        }
        else if (fileGuid == NVRAM_NVAR_PEI_EXTERNAL_DEFAULTS_FILE_GUID) {
            model->setText(index, UString("NVRAM external defaults"));
            return nvramParser->parseNvarStore(index);
        }
        else if (fileGuid == NVRAM_NVAR_BB_DEFAULTS_FILE_GUID) {
            model->setText(index, UString("NVAR BB defaults"));
            return nvramParser->parseNvarStore(index);
        }
        // Parse vendor hash file
        else if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX) {
            return parseVendorHashFile(fileGuid, index);
        }
        // Parse AMI ROM hole
        else if (fileGuid == AMI_ROM_HOLE_FILE_GUID_0
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_1
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_2
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_3
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_4
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_5
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_6
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_7
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_8
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_9
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_10
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_11
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_12
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_13
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_14
                 || fileGuid == AMI_ROM_HOLE_FILE_GUID_15) {
            model->setText(index, UString("AMI ROM hole"));
            // Mark ROM hole file as Fixed in the image
            model->setFixed(index, Fixed);
            // No need to parse further
            return U_SUCCESS;
        }
        
        return parseRawArea(index);
    }
    
    // Parse sections
    return parseSections(model->body(index), index, true);
}